

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O2

int rlbot::Interface::SetGameState(GameState state)

{
  code *pcVar1;
  Offset<rlbot::flat::DesiredGameState> root;
  int iVar2;
  uint8_t *puVar3;
  FlatBufferBuilder builder;
  
  flatbuffers::FlatBufferBuilder::FlatBufferBuilder(&builder,1000,(Allocator *)0x0,false,8);
  root = GameState::BuildFlatBuffer(&state,&builder);
  flatbuffers::FlatBufferBuilder::Finish<rlbot::flat::DesiredGameState>(&builder,root,(char *)0x0);
  pcVar1 = _setGameState;
  puVar3 = flatbuffers::FlatBufferBuilder::GetBufferPointer(&builder);
  iVar2 = (*pcVar1)(puVar3,((int)builder.buf_.reserved_ - (int)builder.buf_.cur_) +
                           (int)builder.buf_.buf_);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(&builder);
  return iVar2;
}

Assistant:

int Interface::SetGameState(GameState state) {
  flatbuffers::FlatBufferBuilder builder(1000);
  builder.Finish(state.BuildFlatBuffer(builder));

  return _setGameState(builder.GetBufferPointer(), builder.GetSize());
}